

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

ExpEmit __thiscall FxFlopFunctionCall::Emit(FxFlopFunctionCall *this,VMFunctionBuilder *build)

{
  PType *pPVar1;
  int iVar2;
  FxExpression **ppFVar3;
  undefined4 extraout_var;
  ExpEmit local_30;
  ExpEmit local_28;
  ExpEmit from;
  VMFunctionBuilder *build_local;
  FxFlopFunctionCall *this_local;
  ExpEmit to;
  
  pPVar1 = (this->super_FxExpression).ValueType;
  from = (ExpEmit)build;
  ppFVar3 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                      (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,0);
  if (pPVar1 != (*ppFVar3)->ValueType) {
    __assert_fail("ValueType == ArgList[0]->ValueType",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0x200e,"virtual ExpEmit FxFlopFunctionCall::Emit(VMFunctionBuilder *)");
  }
  ppFVar3 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                      (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,0);
  local_28._0_4_ = (*(*ppFVar3)->_vptr_FxExpression[9])(*ppFVar3,from);
  local_28.Konst = (bool)(char)extraout_var;
  local_28.Fixed = (bool)(char)((uint)extraout_var >> 8);
  local_28.Final = (bool)(char)((uint)extraout_var >> 0x10);
  local_28.Target = (bool)(char)((uint)extraout_var >> 0x18);
  ExpEmit::ExpEmit((ExpEmit *)&this_local);
  if (((ulong)local_28 & 0x100000000) == 0) {
    iVar2 = PType::GetRegCount((this->super_FxExpression).ValueType);
    if (iVar2 == 1) {
      if (((ulong)local_28 & 0x10000000000) == 0) {
        this_local = (FxFlopFunctionCall *)local_28;
      }
      else {
        ExpEmit::ExpEmit(&local_30,(VMFunctionBuilder *)from,(uint)local_28.RegType,1);
        this_local = (FxFlopFunctionCall *)local_30;
        ExpEmit::Free(&local_28,(VMFunctionBuilder *)from);
      }
      VMFunctionBuilder::Emit
                ((VMFunctionBuilder *)from,0xac,(uint)(ushort)this_local,(uint)local_28.RegNum,
                 FxFlops[this->Index].Flop);
      TDeletingArray<FxExpression_*,_FxExpression_*>::DeleteAndClear(&this->ArgList);
      TArray<FxExpression_*,_FxExpression_*>::ShrinkToFit
                (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>);
      return (ExpEmit)this_local;
    }
    __assert_fail("ValueType->GetRegCount() == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0x2012,"virtual ExpEmit FxFlopFunctionCall::Emit(VMFunctionBuilder *)");
  }
  __assert_fail("from.Konst == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                ,0x2011,"virtual ExpEmit FxFlopFunctionCall::Emit(VMFunctionBuilder *)");
}

Assistant:

ExpEmit FxFlopFunctionCall::Emit(VMFunctionBuilder *build)
{
	assert(ValueType == ArgList[0]->ValueType);
	ExpEmit from = ArgList[0]->Emit(build);
	ExpEmit to;
	assert(from.Konst == 0);
	assert(ValueType->GetRegCount() == 1);
	// Do it in-place, unless a local variable
	if (from.Fixed)
	{
		to = ExpEmit(build, from.RegType);
		from.Free(build);
	}
	else
	{
		to = from;
	}

	build->Emit(OP_FLOP, to.RegNum, from.RegNum, FxFlops[Index].Flop);
	ArgList.DeleteAndClear();
	ArgList.ShrinkToFit();
	return to;
}